

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DictionaryFeatureType::set_allocated_int64keytype
          (DictionaryFeatureType *this,Int64FeatureType *int64keytype)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Int64FeatureType *int64keytype_local;
  DictionaryFeatureType *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_KeyType(this);
  if (int64keytype != (Int64FeatureType *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::InternalHelper<CoreML::Specification::Int64FeatureType>::
         GetOwningArena(int64keytype);
    message_arena = (Arena *)int64keytype;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::Int64FeatureType>
                              (message_arena_00,int64keytype,submessage_arena_00);
    }
    set_has_int64keytype(this);
    (this->KeyType_).int64keytype_ = (Int64FeatureType *)message_arena;
  }
  return;
}

Assistant:

void DictionaryFeatureType::set_allocated_int64keytype(::CoreML::Specification::Int64FeatureType* int64keytype) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_KeyType();
  if (int64keytype) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::Int64FeatureType>::GetOwningArena(int64keytype);
    if (message_arena != submessage_arena) {
      int64keytype = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, int64keytype, submessage_arena);
    }
    set_has_int64keytype();
    KeyType_.int64keytype_ = int64keytype;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.DictionaryFeatureType.int64KeyType)
}